

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gssc.c
# Opt level: O0

Ssh_gss_stat ssh_gssapi_display_status(ssh_gss_library *lib,Ssh_gss_ctx ctx,Ssh_gss_buf *buf)

{
  int iVar1;
  t_gss_display_status p_Var2;
  size_t local_68;
  gss_buffer_desc msg_min;
  gss_buffer_desc msg_maj;
  OM_uint32 ccc;
  OM_uint32 lmax;
  OM_uint32 lmin;
  gssapi_ssh_gss_ctx *gssctx;
  gssapi_functions *gss;
  Ssh_gss_buf *buf_local;
  Ssh_gss_ctx ctx_local;
  ssh_gss_library *lib_local;
  
  gssctx = (gssapi_ssh_gss_ctx *)&lib->u;
  _lmax = (undefined4 *)ctx;
  gss = (gssapi_functions *)buf;
  buf_local = (Ssh_gss_buf *)ctx;
  ctx_local = lib;
  memset(&msg_min.value,0,0x10);
  memset(&local_68,0,0x10);
  gss->delete_sec_context = (t_gss_delete_sec_context)0x0;
  gss->display_status = (t_gss_display_status)0x0;
  msg_maj.value._4_4_ = 0;
  iVar1 = (*(code *)gssctx->ctx)
                    (&ccc,*_lmax,1,&gss_mech_krb5_desc,(undefined1 *)((long)&msg_maj.value + 4),
                     &msg_min.value);
  if (iVar1 == 0) {
    msg_maj.value._4_4_ = 0;
    iVar1 = (*(code *)gssctx->ctx)
                      (&ccc,_lmax[1],2,&gss_mech_krb5_desc,(undefined1 *)((long)&msg_maj.value + 4),
                       &local_68);
    if (iVar1 == 0) {
      gss->delete_sec_context = (t_gss_delete_sec_context)((long)msg_min.value + local_68 + 1);
      p_Var2 = (t_gss_display_status)safemalloc((size_t)(gss->delete_sec_context + 1),1,0);
      gss->display_status = p_Var2;
      memcpy(gss->display_status,(void *)msg_maj.length,(size_t)msg_min.value);
      gss->display_status[(long)msg_min.value] =
           (_func_OM_uint32_OM_uint32_ptr_OM_uint32_int_gss_OID_OM_uint32_ptr_gss_buffer_t)0x20;
      memcpy(gss->display_status + (long)msg_min.value + 1,(void *)msg_min.length,local_68);
      gss->display_status[(long)gss->delete_sec_context] =
           (_func_OM_uint32_OM_uint32_ptr_OM_uint32_int_gss_OID_OM_uint32_ptr_gss_buffer_t)0x0;
      (**(code **)(gssctx + 2))(&ccc,&msg_min.value);
      (**(code **)(gssctx + 2))(&ccc,&local_68);
      lib_local._4_4_ = SSH_GSS_OK;
    }
    else {
      (**(code **)(gssctx + 2))(&ccc,&msg_min.value);
      lib_local._4_4_ = SSH_GSS_FAILURE;
    }
  }
  else {
    lib_local._4_4_ = SSH_GSS_FAILURE;
  }
  return lib_local._4_4_;
}

Assistant:

static Ssh_gss_stat ssh_gssapi_display_status(struct ssh_gss_library *lib,
                                              Ssh_gss_ctx ctx,
                                              Ssh_gss_buf *buf)
{
    struct gssapi_functions *gss = &lib->u.gssapi;
    gssapi_ssh_gss_ctx *gssctx = (gssapi_ssh_gss_ctx *) ctx;
    OM_uint32 lmin,lmax;
    OM_uint32 ccc;
    gss_buffer_desc msg_maj=GSS_C_EMPTY_BUFFER;
    gss_buffer_desc msg_min=GSS_C_EMPTY_BUFFER;

    /* Return empty buffer in case of failure */
    SSH_GSS_CLEAR_BUF(buf);

    /* get first mesg from GSS */
    ccc=0;
    lmax=gss->display_status(&lmin,gssctx->maj_stat,GSS_C_GSS_CODE,(gss_OID) GSS_MECH_KRB5,&ccc,&msg_maj);

    if (lmax != GSS_S_COMPLETE) return SSH_GSS_FAILURE;

    /* get first mesg from Kerberos */
    ccc=0;
    lmax=gss->display_status(&lmin,gssctx->min_stat,GSS_C_MECH_CODE,(gss_OID) GSS_MECH_KRB5,&ccc,&msg_min);

    if (lmax != GSS_S_COMPLETE) {
        gss->release_buffer(&lmin, &msg_maj);
        return SSH_GSS_FAILURE;
    }

    /* copy data into buffer */
    buf->length = msg_maj.length + msg_min.length + 1;
    buf->value = snewn(buf->length + 1, char);

    /* copy mem */
    memcpy((char *)buf->value, msg_maj.value, msg_maj.length);
    ((char *)buf->value)[msg_maj.length] = ' ';
    memcpy((char *)buf->value + msg_maj.length + 1, msg_min.value, msg_min.length);
    ((char *)buf->value)[buf->length] = 0;
    /* free mem & exit */
    gss->release_buffer(&lmin, &msg_maj);
    gss->release_buffer(&lmin, &msg_min);
    return SSH_GSS_OK;
}